

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

void add_door(level *lev,int x,int y,mkroom *aroom)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  schar *psVar5;
  xchar xVar6;
  xchar xVar7;
  long lVar8;
  
  aroom->doorct = aroom->doorct + '\x01';
  iVar3 = lev->doorindex;
  lVar4 = (long)iVar3;
  xVar7 = (xchar)x;
  xVar6 = (xchar)y;
  if (aroom[1].hx < '\0') {
    lev->doorindex = iVar3 + 1;
    lev->doors[lVar4].x = xVar7;
    lev->doors[lVar4].y = xVar6;
    return;
  }
  if (aroom[1].fdoor < iVar3) {
    lVar8 = lVar4 << 0x20;
    do {
      lVar8 = lVar8 + -0x100000000;
      lev->doors[lVar4] = lev->doors[lVar4 + -1];
      lVar4 = lVar4 + -1;
    } while (aroom[1].fdoor < lVar4);
    cVar2 = aroom[1].hx;
    lev->doorindex = lev->doorindex + 1;
    (&lev->doors[0].x)[lVar8 >> 0x1f] = xVar7;
    (&lev->doors[0].y)[lVar8 >> 0x1f] = xVar6;
    if (cVar2 < '\0') {
      return;
    }
  }
  else {
    lev->doorindex = iVar3 + 1;
    lev->doors[lVar4].x = xVar7;
    lev->doors[lVar4].y = xVar6;
  }
  psVar5 = &aroom[1].fdoor;
  do {
    *psVar5 = *psVar5 + '\x01';
    pcVar1 = psVar5 + 0xd1;
    psVar5 = psVar5 + 0xd8;
  } while (-1 < *pcVar1);
  return;
}

Assistant:

void add_door(struct level *lev, int x, int y, struct mkroom *aroom)
{
	struct mkroom *broom;
	int tmp;

	aroom->doorct++;
	broom = aroom+1;
	if (broom->hx < 0)
		tmp = lev->doorindex;
	else
		for (tmp = lev->doorindex; tmp > broom->fdoor; tmp--)
			lev->doors[tmp] = lev->doors[tmp-1];
	lev->doorindex++;
	lev->doors[tmp].x = x;
	lev->doors[tmp].y = y;
	for ( ; broom->hx >= 0; broom++) broom->fdoor++;
}